

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_SetupPortals(void)

{
  bool bVar1;
  MetaClass *pMVar2;
  FSectorPortal *pFVar3;
  FSectorPortal *pFVar4;
  FSectorPortal *pFVar5;
  AActor *pAVar6;
  DVector3 local_100;
  DVector3 local_e8;
  TVector3<double> local_d0;
  TVector2<double> local_b8;
  FSectorPortal *local_a8;
  FSectorPortal *s_1;
  iterator __end1_1;
  iterator __begin1_1;
  TArray<FSectorPortal,_FSectorPortal> *__range1_1;
  FSectorPortal *ss;
  iterator __end3;
  iterator __begin3;
  TArray<FSectorPortal,_FSectorPortal> *__range3;
  FSectorPortal *s;
  iterator __end1;
  iterator __begin1;
  TArray<FSectorPortal,_FSectorPortal> *__range1;
  FName nm;
  undefined1 local_38 [8];
  TArray<AStackPoint_*,_AStackPoint_*> points;
  AStackPoint *pt;
  TThinkerIterator<AStackPoint> it;
  
  TThinkerIterator<AStackPoint>::TThinkerIterator((TThinkerIterator<AStackPoint> *)&pt,0x80);
  TArray<AStackPoint_*,_AStackPoint_*>::TArray((TArray<AStackPoint_*,_AStackPoint_*> *)local_38);
  while (points._8_8_ = TThinkerIterator<AStackPoint>::Next
                                  ((TThinkerIterator<AStackPoint> *)&pt,false),
        (AActor *)points._8_8_ != (AActor *)0x0) {
    pMVar2 = AActor::GetClass((AActor *)points._8_8_);
    FName::FName((FName *)&__range1,
                 &(pMVar2->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName
                );
    bVar1 = FName::operator==((FName *)&__range1,NAME_UpperStackLookOnly);
    if (bVar1) {
      SetupFloorPortal((AStackPoint *)points._8_8_);
    }
    else {
      bVar1 = FName::operator==((FName *)&__range1,NAME_LowerStackLookOnly);
      if (bVar1) {
        SetupCeilingPortal((AStackPoint *)points._8_8_);
      }
    }
    *(undefined4 *)(points._8_8_ + 0x1dc) = 0;
    TArray<AStackPoint_*,_AStackPoint_*>::Push
              ((TArray<AStackPoint_*,_AStackPoint_*> *)local_38,(AStackPoint **)&points.Most);
  }
  __end1 = TArray<FSectorPortal,_FSectorPortal>::begin(&sectorPortals);
  s = (FSectorPortal *)TArray<FSectorPortal,_FSectorPortal>::end(&sectorPortals);
  while (bVar1 = TIterator<FSectorPortal>::operator!=(&__end1,(TIterator<FSectorPortal> *)&s), bVar1
        ) {
    pFVar3 = TIterator<FSectorPortal>::operator*(&__end1);
    if ((pFVar3->mType == 1) &&
       (pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pFVar3->mSkybox),
       pAVar6 != (AActor *)0x0)) {
      __end3 = TArray<FSectorPortal,_FSectorPortal>::begin(&sectorPortals);
      ss = (FSectorPortal *)TArray<FSectorPortal,_FSectorPortal>::end(&sectorPortals);
      while (bVar1 = TIterator<FSectorPortal>::operator!=(&__end3,(TIterator<FSectorPortal> *)&ss),
            bVar1) {
        pFVar4 = TIterator<FSectorPortal>::operator*(&__end3);
        if (pFVar4->mType == 1) {
          pAVar6 = TObjPtr<AActor>::operator->(&pFVar3->mSkybox);
          pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pAVar6->target);
          bVar1 = TObjPtr<AActor>::operator==(&pFVar4->mSkybox,pAVar6);
          if (bVar1) {
            pFVar5 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,0);
            pFVar3->mPartner = (uint)((long)pFVar4 - (long)pFVar5 >> 6);
          }
        }
        TIterator<FSectorPortal>::operator++(&__end3);
      }
    }
    TIterator<FSectorPortal>::operator++(&__end1);
  }
  __end1_1 = TArray<FSectorPortal,_FSectorPortal>::begin(&sectorPortals);
  s_1 = (FSectorPortal *)TArray<FSectorPortal,_FSectorPortal>::end(&sectorPortals);
  while (bVar1 = TIterator<FSectorPortal>::operator!=(&__end1_1,(TIterator<FSectorPortal> *)&s_1),
        bVar1) {
    local_a8 = TIterator<FSectorPortal>::operator*(&__end1_1);
    if ((local_a8->mType == 1) &&
       (pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_a8->mSkybox),
       pAVar6 != (AActor *)0x0)) {
      pAVar6 = TObjPtr<AActor>::operator->(&local_a8->mSkybox);
      AActor::Pos(&local_e8,pAVar6);
      pAVar6 = TObjPtr<AActor>::operator->(&local_a8->mSkybox);
      pAVar6 = TObjPtr<AActor>::operator->(&pAVar6->target);
      AActor::Pos(&local_100,pAVar6);
      TVector3<double>::operator-(&local_d0,&local_e8,&local_100);
      TVector2<double>::TVector2(&local_b8,&local_d0);
      TVector2<double>::operator=(&local_a8->mDisplacement,&local_b8);
      TObjPtr<AActor>::operator=(&local_a8->mSkybox,(AActor *)0x0);
    }
    TIterator<FSectorPortal>::operator++(&__end1_1);
  }
  TArray<AStackPoint_*,_AStackPoint_*>::~TArray((TArray<AStackPoint_*,_AStackPoint_*> *)local_38);
  return;
}

Assistant:

void P_SetupPortals()
{
	TThinkerIterator<AStackPoint> it;
	AStackPoint *pt;
	TArray<AStackPoint *> points;

	while ((pt = it.Next()))
	{
		FName nm = pt->GetClass()->TypeName;
		if (nm == NAME_UpperStackLookOnly)
		{
			SetupFloorPortal(pt);
		}
		else if (nm == NAME_LowerStackLookOnly)
		{
			SetupCeilingPortal(pt);
		}
		pt->special1 = 0;
		points.Push(pt);
	}
	// the semantics here are incredibly lax so the final setup can only be done once all portals have been created,
	// because later stackpoints will happily overwrite info in older ones, if there are multiple links.
	for (auto &s : sectorPortals)
	{
		if (s.mType == PORTS_STACKEDSECTORTHING && s.mSkybox)
		{
			for (auto &ss : sectorPortals)
			{
				if (ss.mType == PORTS_STACKEDSECTORTHING && ss.mSkybox == s.mSkybox->target)
				{
					s.mPartner = unsigned((&ss) - &sectorPortals[0]);
				}
			}
		}
	}
	// Now we can finally set the displacement and delete the stackpoint reference.
	for (auto &s : sectorPortals)
	{
		if (s.mType == PORTS_STACKEDSECTORTHING && s.mSkybox)
		{
			s.mDisplacement = s.mSkybox->Pos() - s.mSkybox->target->Pos();
			s.mSkybox = NULL;
		}
	}
}